

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::StructSchema::Field>::dispose
          (ArrayBuilder<capnp::StructSchema::Field> *this)

{
  Field *firstElement;
  RemoveConst<capnp::StructSchema::Field> *pRVar1;
  Field *pFVar2;
  Field *endCopy;
  Field *posCopy;
  Field *ptrCopy;
  ArrayBuilder<capnp::StructSchema::Field> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pFVar2 = this->endPtr;
  if (firstElement != (Field *)0x0) {
    this->ptr = (Field *)0x0;
    this->pos = (RemoveConst<capnp::StructSchema::Field> *)0x0;
    this->endPtr = (Field *)0x0;
    ArrayDisposer::dispose<capnp::StructSchema::Field>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 6,
               (long)pFVar2 - (long)firstElement >> 6);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }